

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::rejectLeave
          (SPxSolverBase<double> *this,int leaveNum,SPxId leaveId,Status leaveStat,
          SVectorBase<double> *param_5)

{
  double dVar1;
  bool bVar2;
  Status *pSVar3;
  double *pdVar4;
  Status in_ECX;
  SPxSolverBase<double> *in_RDI;
  Desc *ds;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Status local_18;
  int local_14 [3];
  SPxId local_8;
  
  local_18 = in_ECX;
  SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  bVar2 = SPxId::isSPxRowId(&local_8);
  if (bVar2) {
    pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[44],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
              (in_RDI,(char (*) [44])"DLEAVE58 rejectLeave()  : row {}: {} -> {}\n",local_14,pSVar3,
               &local_18);
    if (local_18 == D_ON_BOTH) {
      pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      if (*pSVar3 == P_ON_LOWER) {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        *pdVar4 = dVar1;
      }
      else {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        *pdVar4 = dVar1;
      }
    }
    pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    *pSVar3 = local_18;
  }
  else {
    pSVar3 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[44],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
              (in_RDI,(char (*) [44])"DLEAVE59 rejectLeave()  : col {}: {} -> {}\n",local_14,pSVar3,
               &local_18);
    if (local_18 == D_ON_BOTH) {
      pSVar3 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c);
      if (*pSVar3 == P_ON_UPPER) {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        *pdVar4 = dVar1;
      }
      else {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
        *pdVar4 = dVar1;
      }
    }
    pSVar3 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)CONCAT44(local_18,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    *pSVar3 = local_18;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::rejectLeave(
   int leaveNum,
   SPxId leaveId,
   typename SPxBasisBase<R>::Desc::Status leaveStat,
   const SVectorBase<R>* //newVec
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(leaveId.isSPxRowId())
   {
      SPxOut::debug(this, "DLEAVE58 rejectLeave()  : row {}: {} -> {}\n", leaveNum,
                    ds.rowStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.rowStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_LOWER)
            theLRbound[leaveNum] = theURbound[leaveNum];
         else
            theURbound[leaveNum] = theLRbound[leaveNum];
      }

      ds.rowStatus(leaveNum) = leaveStat;
   }
   else
   {
      SPxOut::debug(this, "DLEAVE59 rejectLeave()  : col {}: {} -> {}\n", leaveNum,
                    ds.colStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.colStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_UPPER)
            theLCbound[leaveNum] = theUCbound[leaveNum];
         else
            theUCbound[leaveNum] = theLCbound[leaveNum];
      }

      ds.colStatus(leaveNum) = leaveStat;
   }
}